

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_time.cpp
# Opt level: O1

void __thiscall Am_Time::operator-=(Am_Time *this,unsigned_long msec)

{
  Am_Time_Data *pAVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  pAVar1 = this->data;
  lVar2 = (pAVar1->time).tv_usec;
  uVar4 = msec * -1000 + lVar2;
  if ((long)uVar4 < 0) {
    uVar5 = 0xfffffffffff0bdc0;
    if (-1000000 < (long)uVar4) {
      uVar5 = uVar4;
    }
    lVar3 = uVar5 + msec * 1000;
    uVar5 = (ulong)(lVar3 != lVar2);
    uVar5 = ((lVar3 - lVar2) - uVar5) / 1000000 + uVar5;
    uVar4 = uVar5 * 1000000 + lVar2 + msec * -1000 + 1000000;
    (pAVar1->time).tv_sec = (pAVar1->time).tv_sec + ~uVar5;
  }
  (pAVar1->time).tv_sec = (pAVar1->time).tv_sec + uVar4 / 1000000;
  (pAVar1->time).tv_usec = uVar4 % 1000000;
  return;
}

Assistant:

void
Am_Time::operator-=(unsigned long msec)
{
  long total_usec = data->time.tv_usec - msec * 1000;
  while (total_usec < 0) {
    total_usec += 1000000;
    data->time.tv_sec--;
  }
  data->time.tv_sec = data->time.tv_sec + total_usec / 1000000;
  data->time.tv_usec = total_usec % 1000000;
}